

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glew.c
# Opt level: O0

GLenum glxewContextInit(void)

{
  GLboolean GVar1;
  GLuint GVar2;
  Display *pDVar3;
  GLubyte *end;
  GLubyte *extEnd;
  GLubyte *extStart;
  int local_10;
  int minor;
  int major;
  
  GVar1 = _glewInit_GLX_VERSION_1_2();
  if (GVar1 == '\0') {
    __GLXEW_VERSION_1_0 = '\x01';
    __GLXEW_VERSION_1_1 = '\x01';
    __GLXEW_VERSION_1_2 = '\x01';
    __GLXEW_VERSION_1_3 = '\x01';
    __GLXEW_VERSION_1_4 = '\x01';
    pDVar3 = (*__glewXGetCurrentDisplay)();
    glXQueryVersion(pDVar3,&local_10,(long)&extStart + 4);
    if ((local_10 == 1) && (extStart._4_4_ < 4)) {
      if (extStart._4_4_ == 2) {
        __GLXEW_VERSION_1_3 = '\0';
      }
      else if (extStart._4_4_ != 3) {
        return 3;
      }
      __GLXEW_VERSION_1_4 = '\0';
    }
    extEnd = (GLubyte *)0x0;
    if (__glewXGetCurrentDisplay != (PFNGLXGETCURRENTDISPLAYPROC)0x0) {
      pDVar3 = (*__glewXGetCurrentDisplay)();
      extEnd = (GLubyte *)glXGetClientString(pDVar3,3);
    }
    if (extEnd == (GLubyte *)0x0) {
      extEnd = "";
    }
    GVar2 = _glewStrLen(extEnd);
    end = extEnd + GVar2;
    if ((glewExperimental != '\0') || (__GLXEW_VERSION_1_3 != '\0')) {
      GVar1 = _glewInit_GLX_VERSION_1_3();
      __GLXEW_VERSION_1_3 = (GVar1 != '\0' ^ 0xffU) & 1;
    }
    __GLXEW_3DFX_multisample = _glewSearchExtension("GLX_3DFX_multisample",extEnd,end);
    __GLXEW_AMD_gpu_association = _glewSearchExtension("GLX_AMD_gpu_association",extEnd,end);
    if ((glewExperimental != '\0') || (__GLXEW_AMD_gpu_association != '\0')) {
      GVar1 = _glewInit_GLX_AMD_gpu_association();
      __GLXEW_AMD_gpu_association = (GVar1 != '\0' ^ 0xffU) & 1;
    }
    __GLXEW_ARB_context_flush_control =
         _glewSearchExtension("GLX_ARB_context_flush_control",extEnd,end);
    __GLXEW_ARB_create_context = _glewSearchExtension("GLX_ARB_create_context",extEnd,end);
    if ((glewExperimental != '\0') || (__GLXEW_ARB_create_context != '\0')) {
      GVar1 = _glewInit_GLX_ARB_create_context();
      __GLXEW_ARB_create_context = (GVar1 != '\0' ^ 0xffU) & 1;
    }
    __GLXEW_ARB_create_context_profile =
         _glewSearchExtension("GLX_ARB_create_context_profile",extEnd,end);
    __GLXEW_ARB_create_context_robustness =
         _glewSearchExtension("GLX_ARB_create_context_robustness",extEnd,end);
    __GLXEW_ARB_fbconfig_float = _glewSearchExtension("GLX_ARB_fbconfig_float",extEnd,end);
    __GLXEW_ARB_framebuffer_sRGB = _glewSearchExtension("GLX_ARB_framebuffer_sRGB",extEnd,end);
    __GLXEW_ARB_get_proc_address = _glewSearchExtension("GLX_ARB_get_proc_address",extEnd,end);
    __GLXEW_ARB_multisample = _glewSearchExtension("GLX_ARB_multisample",extEnd,end);
    __GLXEW_ARB_robustness_application_isolation =
         _glewSearchExtension("GLX_ARB_robustness_application_isolation",extEnd,end);
    __GLXEW_ARB_robustness_share_group_isolation =
         _glewSearchExtension("GLX_ARB_robustness_share_group_isolation",extEnd,end);
    __GLXEW_ARB_vertex_buffer_object =
         _glewSearchExtension("GLX_ARB_vertex_buffer_object",extEnd,end);
    __GLXEW_ATI_pixel_format_float = _glewSearchExtension("GLX_ATI_pixel_format_float",extEnd,end);
    __GLXEW_ATI_render_texture = _glewSearchExtension("GLX_ATI_render_texture",extEnd,end);
    if ((glewExperimental != '\0') || (__GLXEW_ATI_render_texture != '\0')) {
      GVar1 = _glewInit_GLX_ATI_render_texture();
      __GLXEW_ATI_render_texture = (GVar1 != '\0' ^ 0xffU) & 1;
    }
    __GLXEW_EXT_buffer_age = _glewSearchExtension("GLX_EXT_buffer_age",extEnd,end);
    __GLXEW_EXT_create_context_es2_profile =
         _glewSearchExtension("GLX_EXT_create_context_es2_profile",extEnd,end);
    __GLXEW_EXT_create_context_es_profile =
         _glewSearchExtension("GLX_EXT_create_context_es_profile",extEnd,end);
    __GLXEW_EXT_fbconfig_packed_float =
         _glewSearchExtension("GLX_EXT_fbconfig_packed_float",extEnd,end);
    __GLXEW_EXT_framebuffer_sRGB = _glewSearchExtension("GLX_EXT_framebuffer_sRGB",extEnd,end);
    __GLXEW_EXT_import_context = _glewSearchExtension("GLX_EXT_import_context",extEnd,end);
    if ((glewExperimental != '\0') || (__GLXEW_EXT_import_context != '\0')) {
      GVar1 = _glewInit_GLX_EXT_import_context();
      __GLXEW_EXT_import_context = (GVar1 != '\0' ^ 0xffU) & 1;
    }
    __GLXEW_EXT_scene_marker = _glewSearchExtension("GLX_EXT_scene_marker",extEnd,end);
    __GLXEW_EXT_stereo_tree = _glewSearchExtension("GLX_EXT_stereo_tree",extEnd,end);
    __GLXEW_EXT_swap_control = _glewSearchExtension("GLX_EXT_swap_control",extEnd,end);
    if ((glewExperimental != '\0') || (__GLXEW_EXT_swap_control != '\0')) {
      GVar1 = _glewInit_GLX_EXT_swap_control();
      __GLXEW_EXT_swap_control = (GVar1 != '\0' ^ 0xffU) & 1;
    }
    __GLXEW_EXT_swap_control_tear = _glewSearchExtension("GLX_EXT_swap_control_tear",extEnd,end);
    __GLXEW_EXT_texture_from_pixmap = _glewSearchExtension("GLX_EXT_texture_from_pixmap",extEnd,end)
    ;
    if ((glewExperimental != '\0') || (__GLXEW_EXT_texture_from_pixmap != '\0')) {
      GVar1 = _glewInit_GLX_EXT_texture_from_pixmap();
      __GLXEW_EXT_texture_from_pixmap = (GVar1 != '\0' ^ 0xffU) & 1;
    }
    __GLXEW_EXT_visual_info = _glewSearchExtension("GLX_EXT_visual_info",extEnd,end);
    __GLXEW_EXT_visual_rating = _glewSearchExtension("GLX_EXT_visual_rating",extEnd,end);
    __GLXEW_INTEL_swap_event = _glewSearchExtension("GLX_INTEL_swap_event",extEnd,end);
    __GLXEW_MESA_agp_offset = _glewSearchExtension("GLX_MESA_agp_offset",extEnd,end);
    if ((glewExperimental != '\0') || (__GLXEW_MESA_agp_offset != '\0')) {
      GVar1 = _glewInit_GLX_MESA_agp_offset();
      __GLXEW_MESA_agp_offset = (GVar1 != '\0' ^ 0xffU) & 1;
    }
    __GLXEW_MESA_copy_sub_buffer = _glewSearchExtension("GLX_MESA_copy_sub_buffer",extEnd,end);
    if ((glewExperimental != '\0') || (__GLXEW_MESA_copy_sub_buffer != '\0')) {
      GVar1 = _glewInit_GLX_MESA_copy_sub_buffer();
      __GLXEW_MESA_copy_sub_buffer = (GVar1 != '\0' ^ 0xffU) & 1;
    }
    __GLXEW_MESA_pixmap_colormap = _glewSearchExtension("GLX_MESA_pixmap_colormap",extEnd,end);
    if ((glewExperimental != '\0') || (__GLXEW_MESA_pixmap_colormap != '\0')) {
      GVar1 = _glewInit_GLX_MESA_pixmap_colormap();
      __GLXEW_MESA_pixmap_colormap = (GVar1 != '\0' ^ 0xffU) & 1;
    }
    __GLXEW_MESA_query_renderer = _glewSearchExtension("GLX_MESA_query_renderer",extEnd,end);
    if ((glewExperimental != '\0') || (__GLXEW_MESA_query_renderer != '\0')) {
      GVar1 = _glewInit_GLX_MESA_query_renderer();
      __GLXEW_MESA_query_renderer = (GVar1 != '\0' ^ 0xffU) & 1;
    }
    __GLXEW_MESA_release_buffers = _glewSearchExtension("GLX_MESA_release_buffers",extEnd,end);
    if ((glewExperimental != '\0') || (__GLXEW_MESA_release_buffers != '\0')) {
      GVar1 = _glewInit_GLX_MESA_release_buffers();
      __GLXEW_MESA_release_buffers = (GVar1 != '\0' ^ 0xffU) & 1;
    }
    __GLXEW_MESA_set_3dfx_mode = _glewSearchExtension("GLX_MESA_set_3dfx_mode",extEnd,end);
    if ((glewExperimental != '\0') || (__GLXEW_MESA_set_3dfx_mode != '\0')) {
      GVar1 = _glewInit_GLX_MESA_set_3dfx_mode();
      __GLXEW_MESA_set_3dfx_mode = (GVar1 != '\0' ^ 0xffU) & 1;
    }
    __GLXEW_MESA_swap_control = _glewSearchExtension("GLX_MESA_swap_control",extEnd,end);
    if ((glewExperimental != '\0') || (__GLXEW_MESA_swap_control != '\0')) {
      GVar1 = _glewInit_GLX_MESA_swap_control();
      __GLXEW_MESA_swap_control = (GVar1 != '\0' ^ 0xffU) & 1;
    }
    __GLXEW_NV_copy_buffer = _glewSearchExtension("GLX_NV_copy_buffer",extEnd,end);
    if ((glewExperimental != '\0') || (__GLXEW_NV_copy_buffer != '\0')) {
      GVar1 = _glewInit_GLX_NV_copy_buffer();
      __GLXEW_NV_copy_buffer = (GVar1 != '\0' ^ 0xffU) & 1;
    }
    __GLXEW_NV_copy_image = _glewSearchExtension("GLX_NV_copy_image",extEnd,end);
    if ((glewExperimental != '\0') || (__GLXEW_NV_copy_image != '\0')) {
      GVar1 = _glewInit_GLX_NV_copy_image();
      __GLXEW_NV_copy_image = (GVar1 != '\0' ^ 0xffU) & 1;
    }
    __GLXEW_NV_delay_before_swap = _glewSearchExtension("GLX_NV_delay_before_swap",extEnd,end);
    if ((glewExperimental != '\0') || (__GLXEW_NV_delay_before_swap != '\0')) {
      GVar1 = _glewInit_GLX_NV_delay_before_swap();
      __GLXEW_NV_delay_before_swap = (GVar1 != '\0' ^ 0xffU) & 1;
    }
    __GLXEW_NV_float_buffer = _glewSearchExtension("GLX_NV_float_buffer",extEnd,end);
    __GLXEW_NV_multisample_coverage = _glewSearchExtension("GLX_NV_multisample_coverage",extEnd,end)
    ;
    __GLXEW_NV_present_video = _glewSearchExtension("GLX_NV_present_video",extEnd,end);
    if ((glewExperimental != '\0') || (__GLXEW_NV_present_video != '\0')) {
      GVar1 = _glewInit_GLX_NV_present_video();
      __GLXEW_NV_present_video = (GVar1 != '\0' ^ 0xffU) & 1;
    }
    __GLXEW_NV_swap_group = _glewSearchExtension("GLX_NV_swap_group",extEnd,end);
    if ((glewExperimental != '\0') || (__GLXEW_NV_swap_group != '\0')) {
      GVar1 = _glewInit_GLX_NV_swap_group();
      __GLXEW_NV_swap_group = (GVar1 != '\0' ^ 0xffU) & 1;
    }
    __GLXEW_NV_vertex_array_range = _glewSearchExtension("GLX_NV_vertex_array_range",extEnd,end);
    if ((glewExperimental != '\0') || (__GLXEW_NV_vertex_array_range != '\0')) {
      GVar1 = _glewInit_GLX_NV_vertex_array_range();
      __GLXEW_NV_vertex_array_range = (GVar1 != '\0' ^ 0xffU) & 1;
    }
    __GLXEW_NV_video_capture = _glewSearchExtension("GLX_NV_video_capture",extEnd,end);
    if ((glewExperimental != '\0') || (__GLXEW_NV_video_capture != '\0')) {
      GVar1 = _glewInit_GLX_NV_video_capture();
      __GLXEW_NV_video_capture = (GVar1 != '\0' ^ 0xffU) & 1;
    }
    __GLXEW_NV_video_out = _glewSearchExtension("GLX_NV_video_out",extEnd,end);
    if ((glewExperimental != '\0') || (__GLXEW_NV_video_out != '\0')) {
      GVar1 = _glewInit_GLX_NV_video_out();
      __GLXEW_NV_video_out = (GVar1 != '\0' ^ 0xffU) & 1;
    }
    __GLXEW_OML_swap_method = _glewSearchExtension("GLX_OML_swap_method",extEnd,end);
    __GLXEW_OML_sync_control = _glewSearchExtension("GLX_OML_sync_control",extEnd,end);
    if ((glewExperimental != '\0') || (__GLXEW_OML_sync_control != '\0')) {
      GVar1 = _glewInit_GLX_OML_sync_control();
      __GLXEW_OML_sync_control = (GVar1 != '\0' ^ 0xffU) & 1;
    }
    __GLXEW_SGIS_blended_overlay = _glewSearchExtension("GLX_SGIS_blended_overlay",extEnd,end);
    __GLXEW_SGIS_color_range = _glewSearchExtension("GLX_SGIS_color_range",extEnd,end);
    __GLXEW_SGIS_multisample = _glewSearchExtension("GLX_SGIS_multisample",extEnd,end);
    __GLXEW_SGIS_shared_multisample = _glewSearchExtension("GLX_SGIS_shared_multisample",extEnd,end)
    ;
    __GLXEW_SGIX_fbconfig = _glewSearchExtension("GLX_SGIX_fbconfig",extEnd,end);
    if ((glewExperimental != '\0') || (__GLXEW_SGIX_fbconfig != '\0')) {
      GVar1 = _glewInit_GLX_SGIX_fbconfig();
      __GLXEW_SGIX_fbconfig = (GVar1 != '\0' ^ 0xffU) & 1;
    }
    __GLXEW_SGIX_hyperpipe = _glewSearchExtension("GLX_SGIX_hyperpipe",extEnd,end);
    if ((glewExperimental != '\0') || (__GLXEW_SGIX_hyperpipe != '\0')) {
      GVar1 = _glewInit_GLX_SGIX_hyperpipe();
      __GLXEW_SGIX_hyperpipe = (GVar1 != '\0' ^ 0xffU) & 1;
    }
    __GLXEW_SGIX_pbuffer = _glewSearchExtension("GLX_SGIX_pbuffer",extEnd,end);
    if ((glewExperimental != '\0') || (__GLXEW_SGIX_pbuffer != '\0')) {
      GVar1 = _glewInit_GLX_SGIX_pbuffer();
      __GLXEW_SGIX_pbuffer = (GVar1 != '\0' ^ 0xffU) & 1;
    }
    __GLXEW_SGIX_swap_barrier = _glewSearchExtension("GLX_SGIX_swap_barrier",extEnd,end);
    if ((glewExperimental != '\0') || (__GLXEW_SGIX_swap_barrier != '\0')) {
      GVar1 = _glewInit_GLX_SGIX_swap_barrier();
      __GLXEW_SGIX_swap_barrier = (GVar1 != '\0' ^ 0xffU) & 1;
    }
    __GLXEW_SGIX_swap_group = _glewSearchExtension("GLX_SGIX_swap_group",extEnd,end);
    if ((glewExperimental != '\0') || (__GLXEW_SGIX_swap_group != '\0')) {
      GVar1 = _glewInit_GLX_SGIX_swap_group();
      __GLXEW_SGIX_swap_group = (GVar1 != '\0' ^ 0xffU) & 1;
    }
    __GLXEW_SGIX_video_resize = _glewSearchExtension("GLX_SGIX_video_resize",extEnd,end);
    if ((glewExperimental != '\0') || (__GLXEW_SGIX_video_resize != '\0')) {
      GVar1 = _glewInit_GLX_SGIX_video_resize();
      __GLXEW_SGIX_video_resize = (GVar1 != '\0' ^ 0xffU) & 1;
    }
    __GLXEW_SGIX_visual_select_group =
         _glewSearchExtension("GLX_SGIX_visual_select_group",extEnd,end);
    __GLXEW_SGI_cushion = _glewSearchExtension("GLX_SGI_cushion",extEnd,end);
    if ((glewExperimental != '\0') || (__GLXEW_SGI_cushion != '\0')) {
      GVar1 = _glewInit_GLX_SGI_cushion();
      __GLXEW_SGI_cushion = (GVar1 != '\0' ^ 0xffU) & 1;
    }
    __GLXEW_SGI_make_current_read = _glewSearchExtension("GLX_SGI_make_current_read",extEnd,end);
    if ((glewExperimental != '\0') || (__GLXEW_SGI_make_current_read != '\0')) {
      GVar1 = _glewInit_GLX_SGI_make_current_read();
      __GLXEW_SGI_make_current_read = (GVar1 != '\0' ^ 0xffU) & 1;
    }
    __GLXEW_SGI_swap_control = _glewSearchExtension("GLX_SGI_swap_control",extEnd,end);
    if ((glewExperimental != '\0') || (__GLXEW_SGI_swap_control != '\0')) {
      GVar1 = _glewInit_GLX_SGI_swap_control();
      __GLXEW_SGI_swap_control = (GVar1 != '\0' ^ 0xffU) & 1;
    }
    __GLXEW_SGI_video_sync = _glewSearchExtension("GLX_SGI_video_sync",extEnd,end);
    if ((glewExperimental != '\0') || (__GLXEW_SGI_video_sync != '\0')) {
      GVar1 = _glewInit_GLX_SGI_video_sync();
      __GLXEW_SGI_video_sync = (GVar1 != '\0' ^ 0xffU) & 1;
    }
    __GLXEW_SUN_get_transparent_index =
         _glewSearchExtension("GLX_SUN_get_transparent_index",extEnd,end);
    if ((glewExperimental != '\0') || (__GLXEW_SUN_get_transparent_index != '\0')) {
      GVar1 = _glewInit_GLX_SUN_get_transparent_index();
      __GLXEW_SUN_get_transparent_index = (GVar1 != '\0' ^ 0xffU) & 1;
    }
    __GLXEW_SUN_video_resize = _glewSearchExtension("GLX_SUN_video_resize",extEnd,end);
    if ((glewExperimental != '\0') || (__GLXEW_SUN_video_resize != '\0')) {
      GVar1 = _glewInit_GLX_SUN_video_resize();
      __GLXEW_SUN_video_resize = (GVar1 != '\0' ^ 0xffU) & 1;
    }
    minor = 0;
  }
  else {
    minor = 3;
  }
  return minor;
}

Assistant:

GLenum glxewContextInit (GLXEW_CONTEXT_ARG_DEF_LIST)
{
  int major, minor;
  const GLubyte* extStart;
  const GLubyte* extEnd;
  /* initialize core GLX 1.2 */
  if (_glewInit_GLX_VERSION_1_2(GLEW_CONTEXT_ARG_VAR_INIT)) return GLEW_ERROR_GLX_VERSION_11_ONLY;
  /* initialize flags */
  GLXEW_VERSION_1_0 = GL_TRUE;
  GLXEW_VERSION_1_1 = GL_TRUE;
  GLXEW_VERSION_1_2 = GL_TRUE;
  GLXEW_VERSION_1_3 = GL_TRUE;
  GLXEW_VERSION_1_4 = GL_TRUE;
  /* query GLX version */
  glXQueryVersion(glXGetCurrentDisplay(), &major, &minor);
  if (major == 1 && minor <= 3)
  {
    switch (minor)
    {
      case 3:
      GLXEW_VERSION_1_4 = GL_FALSE;
      break;
      case 2:
      GLXEW_VERSION_1_4 = GL_FALSE;
      GLXEW_VERSION_1_3 = GL_FALSE;
      break;
      default:
      return GLEW_ERROR_GLX_VERSION_11_ONLY;
      break;
    }
  }
  /* query GLX extension string */
  extStart = 0;
  if (glXGetCurrentDisplay != NULL)
    extStart = (const GLubyte*)glXGetClientString(glXGetCurrentDisplay(), GLX_EXTENSIONS);
  if (extStart == 0)
    extStart = (const GLubyte *)"";
  extEnd = extStart + _glewStrLen(extStart);
  /* initialize extensions */
#ifdef GLX_VERSION_1_3
  if (glewExperimental || GLXEW_VERSION_1_3) GLXEW_VERSION_1_3 = !_glewInit_GLX_VERSION_1_3(GLEW_CONTEXT_ARG_VAR_INIT);
#endif /* GLX_VERSION_1_3 */
#ifdef GLX_3DFX_multisample
  GLXEW_3DFX_multisample = _glewSearchExtension("GLX_3DFX_multisample", extStart, extEnd);
#endif /* GLX_3DFX_multisample */
#ifdef GLX_AMD_gpu_association
  GLXEW_AMD_gpu_association = _glewSearchExtension("GLX_AMD_gpu_association", extStart, extEnd);
  if (glewExperimental || GLXEW_AMD_gpu_association) GLXEW_AMD_gpu_association = !_glewInit_GLX_AMD_gpu_association(GLEW_CONTEXT_ARG_VAR_INIT);
#endif /* GLX_AMD_gpu_association */
#ifdef GLX_ARB_context_flush_control
  GLXEW_ARB_context_flush_control = _glewSearchExtension("GLX_ARB_context_flush_control", extStart, extEnd);
#endif /* GLX_ARB_context_flush_control */
#ifdef GLX_ARB_create_context
  GLXEW_ARB_create_context = _glewSearchExtension("GLX_ARB_create_context", extStart, extEnd);
  if (glewExperimental || GLXEW_ARB_create_context) GLXEW_ARB_create_context = !_glewInit_GLX_ARB_create_context(GLEW_CONTEXT_ARG_VAR_INIT);
#endif /* GLX_ARB_create_context */
#ifdef GLX_ARB_create_context_profile
  GLXEW_ARB_create_context_profile = _glewSearchExtension("GLX_ARB_create_context_profile", extStart, extEnd);
#endif /* GLX_ARB_create_context_profile */
#ifdef GLX_ARB_create_context_robustness
  GLXEW_ARB_create_context_robustness = _glewSearchExtension("GLX_ARB_create_context_robustness", extStart, extEnd);
#endif /* GLX_ARB_create_context_robustness */
#ifdef GLX_ARB_fbconfig_float
  GLXEW_ARB_fbconfig_float = _glewSearchExtension("GLX_ARB_fbconfig_float", extStart, extEnd);
#endif /* GLX_ARB_fbconfig_float */
#ifdef GLX_ARB_framebuffer_sRGB
  GLXEW_ARB_framebuffer_sRGB = _glewSearchExtension("GLX_ARB_framebuffer_sRGB", extStart, extEnd);
#endif /* GLX_ARB_framebuffer_sRGB */
#ifdef GLX_ARB_get_proc_address
  GLXEW_ARB_get_proc_address = _glewSearchExtension("GLX_ARB_get_proc_address", extStart, extEnd);
#endif /* GLX_ARB_get_proc_address */
#ifdef GLX_ARB_multisample
  GLXEW_ARB_multisample = _glewSearchExtension("GLX_ARB_multisample", extStart, extEnd);
#endif /* GLX_ARB_multisample */
#ifdef GLX_ARB_robustness_application_isolation
  GLXEW_ARB_robustness_application_isolation = _glewSearchExtension("GLX_ARB_robustness_application_isolation", extStart, extEnd);
#endif /* GLX_ARB_robustness_application_isolation */
#ifdef GLX_ARB_robustness_share_group_isolation
  GLXEW_ARB_robustness_share_group_isolation = _glewSearchExtension("GLX_ARB_robustness_share_group_isolation", extStart, extEnd);
#endif /* GLX_ARB_robustness_share_group_isolation */
#ifdef GLX_ARB_vertex_buffer_object
  GLXEW_ARB_vertex_buffer_object = _glewSearchExtension("GLX_ARB_vertex_buffer_object", extStart, extEnd);
#endif /* GLX_ARB_vertex_buffer_object */
#ifdef GLX_ATI_pixel_format_float
  GLXEW_ATI_pixel_format_float = _glewSearchExtension("GLX_ATI_pixel_format_float", extStart, extEnd);
#endif /* GLX_ATI_pixel_format_float */
#ifdef GLX_ATI_render_texture
  GLXEW_ATI_render_texture = _glewSearchExtension("GLX_ATI_render_texture", extStart, extEnd);
  if (glewExperimental || GLXEW_ATI_render_texture) GLXEW_ATI_render_texture = !_glewInit_GLX_ATI_render_texture(GLEW_CONTEXT_ARG_VAR_INIT);
#endif /* GLX_ATI_render_texture */
#ifdef GLX_EXT_buffer_age
  GLXEW_EXT_buffer_age = _glewSearchExtension("GLX_EXT_buffer_age", extStart, extEnd);
#endif /* GLX_EXT_buffer_age */
#ifdef GLX_EXT_create_context_es2_profile
  GLXEW_EXT_create_context_es2_profile = _glewSearchExtension("GLX_EXT_create_context_es2_profile", extStart, extEnd);
#endif /* GLX_EXT_create_context_es2_profile */
#ifdef GLX_EXT_create_context_es_profile
  GLXEW_EXT_create_context_es_profile = _glewSearchExtension("GLX_EXT_create_context_es_profile", extStart, extEnd);
#endif /* GLX_EXT_create_context_es_profile */
#ifdef GLX_EXT_fbconfig_packed_float
  GLXEW_EXT_fbconfig_packed_float = _glewSearchExtension("GLX_EXT_fbconfig_packed_float", extStart, extEnd);
#endif /* GLX_EXT_fbconfig_packed_float */
#ifdef GLX_EXT_framebuffer_sRGB
  GLXEW_EXT_framebuffer_sRGB = _glewSearchExtension("GLX_EXT_framebuffer_sRGB", extStart, extEnd);
#endif /* GLX_EXT_framebuffer_sRGB */
#ifdef GLX_EXT_import_context
  GLXEW_EXT_import_context = _glewSearchExtension("GLX_EXT_import_context", extStart, extEnd);
  if (glewExperimental || GLXEW_EXT_import_context) GLXEW_EXT_import_context = !_glewInit_GLX_EXT_import_context(GLEW_CONTEXT_ARG_VAR_INIT);
#endif /* GLX_EXT_import_context */
#ifdef GLX_EXT_scene_marker
  GLXEW_EXT_scene_marker = _glewSearchExtension("GLX_EXT_scene_marker", extStart, extEnd);
#endif /* GLX_EXT_scene_marker */
#ifdef GLX_EXT_stereo_tree
  GLXEW_EXT_stereo_tree = _glewSearchExtension("GLX_EXT_stereo_tree", extStart, extEnd);
#endif /* GLX_EXT_stereo_tree */
#ifdef GLX_EXT_swap_control
  GLXEW_EXT_swap_control = _glewSearchExtension("GLX_EXT_swap_control", extStart, extEnd);
  if (glewExperimental || GLXEW_EXT_swap_control) GLXEW_EXT_swap_control = !_glewInit_GLX_EXT_swap_control(GLEW_CONTEXT_ARG_VAR_INIT);
#endif /* GLX_EXT_swap_control */
#ifdef GLX_EXT_swap_control_tear
  GLXEW_EXT_swap_control_tear = _glewSearchExtension("GLX_EXT_swap_control_tear", extStart, extEnd);
#endif /* GLX_EXT_swap_control_tear */
#ifdef GLX_EXT_texture_from_pixmap
  GLXEW_EXT_texture_from_pixmap = _glewSearchExtension("GLX_EXT_texture_from_pixmap", extStart, extEnd);
  if (glewExperimental || GLXEW_EXT_texture_from_pixmap) GLXEW_EXT_texture_from_pixmap = !_glewInit_GLX_EXT_texture_from_pixmap(GLEW_CONTEXT_ARG_VAR_INIT);
#endif /* GLX_EXT_texture_from_pixmap */
#ifdef GLX_EXT_visual_info
  GLXEW_EXT_visual_info = _glewSearchExtension("GLX_EXT_visual_info", extStart, extEnd);
#endif /* GLX_EXT_visual_info */
#ifdef GLX_EXT_visual_rating
  GLXEW_EXT_visual_rating = _glewSearchExtension("GLX_EXT_visual_rating", extStart, extEnd);
#endif /* GLX_EXT_visual_rating */
#ifdef GLX_INTEL_swap_event
  GLXEW_INTEL_swap_event = _glewSearchExtension("GLX_INTEL_swap_event", extStart, extEnd);
#endif /* GLX_INTEL_swap_event */
#ifdef GLX_MESA_agp_offset
  GLXEW_MESA_agp_offset = _glewSearchExtension("GLX_MESA_agp_offset", extStart, extEnd);
  if (glewExperimental || GLXEW_MESA_agp_offset) GLXEW_MESA_agp_offset = !_glewInit_GLX_MESA_agp_offset(GLEW_CONTEXT_ARG_VAR_INIT);
#endif /* GLX_MESA_agp_offset */
#ifdef GLX_MESA_copy_sub_buffer
  GLXEW_MESA_copy_sub_buffer = _glewSearchExtension("GLX_MESA_copy_sub_buffer", extStart, extEnd);
  if (glewExperimental || GLXEW_MESA_copy_sub_buffer) GLXEW_MESA_copy_sub_buffer = !_glewInit_GLX_MESA_copy_sub_buffer(GLEW_CONTEXT_ARG_VAR_INIT);
#endif /* GLX_MESA_copy_sub_buffer */
#ifdef GLX_MESA_pixmap_colormap
  GLXEW_MESA_pixmap_colormap = _glewSearchExtension("GLX_MESA_pixmap_colormap", extStart, extEnd);
  if (glewExperimental || GLXEW_MESA_pixmap_colormap) GLXEW_MESA_pixmap_colormap = !_glewInit_GLX_MESA_pixmap_colormap(GLEW_CONTEXT_ARG_VAR_INIT);
#endif /* GLX_MESA_pixmap_colormap */
#ifdef GLX_MESA_query_renderer
  GLXEW_MESA_query_renderer = _glewSearchExtension("GLX_MESA_query_renderer", extStart, extEnd);
  if (glewExperimental || GLXEW_MESA_query_renderer) GLXEW_MESA_query_renderer = !_glewInit_GLX_MESA_query_renderer(GLEW_CONTEXT_ARG_VAR_INIT);
#endif /* GLX_MESA_query_renderer */
#ifdef GLX_MESA_release_buffers
  GLXEW_MESA_release_buffers = _glewSearchExtension("GLX_MESA_release_buffers", extStart, extEnd);
  if (glewExperimental || GLXEW_MESA_release_buffers) GLXEW_MESA_release_buffers = !_glewInit_GLX_MESA_release_buffers(GLEW_CONTEXT_ARG_VAR_INIT);
#endif /* GLX_MESA_release_buffers */
#ifdef GLX_MESA_set_3dfx_mode
  GLXEW_MESA_set_3dfx_mode = _glewSearchExtension("GLX_MESA_set_3dfx_mode", extStart, extEnd);
  if (glewExperimental || GLXEW_MESA_set_3dfx_mode) GLXEW_MESA_set_3dfx_mode = !_glewInit_GLX_MESA_set_3dfx_mode(GLEW_CONTEXT_ARG_VAR_INIT);
#endif /* GLX_MESA_set_3dfx_mode */
#ifdef GLX_MESA_swap_control
  GLXEW_MESA_swap_control = _glewSearchExtension("GLX_MESA_swap_control", extStart, extEnd);
  if (glewExperimental || GLXEW_MESA_swap_control) GLXEW_MESA_swap_control = !_glewInit_GLX_MESA_swap_control(GLEW_CONTEXT_ARG_VAR_INIT);
#endif /* GLX_MESA_swap_control */
#ifdef GLX_NV_copy_buffer
  GLXEW_NV_copy_buffer = _glewSearchExtension("GLX_NV_copy_buffer", extStart, extEnd);
  if (glewExperimental || GLXEW_NV_copy_buffer) GLXEW_NV_copy_buffer = !_glewInit_GLX_NV_copy_buffer(GLEW_CONTEXT_ARG_VAR_INIT);
#endif /* GLX_NV_copy_buffer */
#ifdef GLX_NV_copy_image
  GLXEW_NV_copy_image = _glewSearchExtension("GLX_NV_copy_image", extStart, extEnd);
  if (glewExperimental || GLXEW_NV_copy_image) GLXEW_NV_copy_image = !_glewInit_GLX_NV_copy_image(GLEW_CONTEXT_ARG_VAR_INIT);
#endif /* GLX_NV_copy_image */
#ifdef GLX_NV_delay_before_swap
  GLXEW_NV_delay_before_swap = _glewSearchExtension("GLX_NV_delay_before_swap", extStart, extEnd);
  if (glewExperimental || GLXEW_NV_delay_before_swap) GLXEW_NV_delay_before_swap = !_glewInit_GLX_NV_delay_before_swap(GLEW_CONTEXT_ARG_VAR_INIT);
#endif /* GLX_NV_delay_before_swap */
#ifdef GLX_NV_float_buffer
  GLXEW_NV_float_buffer = _glewSearchExtension("GLX_NV_float_buffer", extStart, extEnd);
#endif /* GLX_NV_float_buffer */
#ifdef GLX_NV_multisample_coverage
  GLXEW_NV_multisample_coverage = _glewSearchExtension("GLX_NV_multisample_coverage", extStart, extEnd);
#endif /* GLX_NV_multisample_coverage */
#ifdef GLX_NV_present_video
  GLXEW_NV_present_video = _glewSearchExtension("GLX_NV_present_video", extStart, extEnd);
  if (glewExperimental || GLXEW_NV_present_video) GLXEW_NV_present_video = !_glewInit_GLX_NV_present_video(GLEW_CONTEXT_ARG_VAR_INIT);
#endif /* GLX_NV_present_video */
#ifdef GLX_NV_swap_group
  GLXEW_NV_swap_group = _glewSearchExtension("GLX_NV_swap_group", extStart, extEnd);
  if (glewExperimental || GLXEW_NV_swap_group) GLXEW_NV_swap_group = !_glewInit_GLX_NV_swap_group(GLEW_CONTEXT_ARG_VAR_INIT);
#endif /* GLX_NV_swap_group */
#ifdef GLX_NV_vertex_array_range
  GLXEW_NV_vertex_array_range = _glewSearchExtension("GLX_NV_vertex_array_range", extStart, extEnd);
  if (glewExperimental || GLXEW_NV_vertex_array_range) GLXEW_NV_vertex_array_range = !_glewInit_GLX_NV_vertex_array_range(GLEW_CONTEXT_ARG_VAR_INIT);
#endif /* GLX_NV_vertex_array_range */
#ifdef GLX_NV_video_capture
  GLXEW_NV_video_capture = _glewSearchExtension("GLX_NV_video_capture", extStart, extEnd);
  if (glewExperimental || GLXEW_NV_video_capture) GLXEW_NV_video_capture = !_glewInit_GLX_NV_video_capture(GLEW_CONTEXT_ARG_VAR_INIT);
#endif /* GLX_NV_video_capture */
#ifdef GLX_NV_video_out
  GLXEW_NV_video_out = _glewSearchExtension("GLX_NV_video_out", extStart, extEnd);
  if (glewExperimental || GLXEW_NV_video_out) GLXEW_NV_video_out = !_glewInit_GLX_NV_video_out(GLEW_CONTEXT_ARG_VAR_INIT);
#endif /* GLX_NV_video_out */
#ifdef GLX_OML_swap_method
  GLXEW_OML_swap_method = _glewSearchExtension("GLX_OML_swap_method", extStart, extEnd);
#endif /* GLX_OML_swap_method */
#ifdef GLX_OML_sync_control
  GLXEW_OML_sync_control = _glewSearchExtension("GLX_OML_sync_control", extStart, extEnd);
  if (glewExperimental || GLXEW_OML_sync_control) GLXEW_OML_sync_control = !_glewInit_GLX_OML_sync_control(GLEW_CONTEXT_ARG_VAR_INIT);
#endif /* GLX_OML_sync_control */
#ifdef GLX_SGIS_blended_overlay
  GLXEW_SGIS_blended_overlay = _glewSearchExtension("GLX_SGIS_blended_overlay", extStart, extEnd);
#endif /* GLX_SGIS_blended_overlay */
#ifdef GLX_SGIS_color_range
  GLXEW_SGIS_color_range = _glewSearchExtension("GLX_SGIS_color_range", extStart, extEnd);
#endif /* GLX_SGIS_color_range */
#ifdef GLX_SGIS_multisample
  GLXEW_SGIS_multisample = _glewSearchExtension("GLX_SGIS_multisample", extStart, extEnd);
#endif /* GLX_SGIS_multisample */
#ifdef GLX_SGIS_shared_multisample
  GLXEW_SGIS_shared_multisample = _glewSearchExtension("GLX_SGIS_shared_multisample", extStart, extEnd);
#endif /* GLX_SGIS_shared_multisample */
#ifdef GLX_SGIX_fbconfig
  GLXEW_SGIX_fbconfig = _glewSearchExtension("GLX_SGIX_fbconfig", extStart, extEnd);
  if (glewExperimental || GLXEW_SGIX_fbconfig) GLXEW_SGIX_fbconfig = !_glewInit_GLX_SGIX_fbconfig(GLEW_CONTEXT_ARG_VAR_INIT);
#endif /* GLX_SGIX_fbconfig */
#ifdef GLX_SGIX_hyperpipe
  GLXEW_SGIX_hyperpipe = _glewSearchExtension("GLX_SGIX_hyperpipe", extStart, extEnd);
  if (glewExperimental || GLXEW_SGIX_hyperpipe) GLXEW_SGIX_hyperpipe = !_glewInit_GLX_SGIX_hyperpipe(GLEW_CONTEXT_ARG_VAR_INIT);
#endif /* GLX_SGIX_hyperpipe */
#ifdef GLX_SGIX_pbuffer
  GLXEW_SGIX_pbuffer = _glewSearchExtension("GLX_SGIX_pbuffer", extStart, extEnd);
  if (glewExperimental || GLXEW_SGIX_pbuffer) GLXEW_SGIX_pbuffer = !_glewInit_GLX_SGIX_pbuffer(GLEW_CONTEXT_ARG_VAR_INIT);
#endif /* GLX_SGIX_pbuffer */
#ifdef GLX_SGIX_swap_barrier
  GLXEW_SGIX_swap_barrier = _glewSearchExtension("GLX_SGIX_swap_barrier", extStart, extEnd);
  if (glewExperimental || GLXEW_SGIX_swap_barrier) GLXEW_SGIX_swap_barrier = !_glewInit_GLX_SGIX_swap_barrier(GLEW_CONTEXT_ARG_VAR_INIT);
#endif /* GLX_SGIX_swap_barrier */
#ifdef GLX_SGIX_swap_group
  GLXEW_SGIX_swap_group = _glewSearchExtension("GLX_SGIX_swap_group", extStart, extEnd);
  if (glewExperimental || GLXEW_SGIX_swap_group) GLXEW_SGIX_swap_group = !_glewInit_GLX_SGIX_swap_group(GLEW_CONTEXT_ARG_VAR_INIT);
#endif /* GLX_SGIX_swap_group */
#ifdef GLX_SGIX_video_resize
  GLXEW_SGIX_video_resize = _glewSearchExtension("GLX_SGIX_video_resize", extStart, extEnd);
  if (glewExperimental || GLXEW_SGIX_video_resize) GLXEW_SGIX_video_resize = !_glewInit_GLX_SGIX_video_resize(GLEW_CONTEXT_ARG_VAR_INIT);
#endif /* GLX_SGIX_video_resize */
#ifdef GLX_SGIX_visual_select_group
  GLXEW_SGIX_visual_select_group = _glewSearchExtension("GLX_SGIX_visual_select_group", extStart, extEnd);
#endif /* GLX_SGIX_visual_select_group */
#ifdef GLX_SGI_cushion
  GLXEW_SGI_cushion = _glewSearchExtension("GLX_SGI_cushion", extStart, extEnd);
  if (glewExperimental || GLXEW_SGI_cushion) GLXEW_SGI_cushion = !_glewInit_GLX_SGI_cushion(GLEW_CONTEXT_ARG_VAR_INIT);
#endif /* GLX_SGI_cushion */
#ifdef GLX_SGI_make_current_read
  GLXEW_SGI_make_current_read = _glewSearchExtension("GLX_SGI_make_current_read", extStart, extEnd);
  if (glewExperimental || GLXEW_SGI_make_current_read) GLXEW_SGI_make_current_read = !_glewInit_GLX_SGI_make_current_read(GLEW_CONTEXT_ARG_VAR_INIT);
#endif /* GLX_SGI_make_current_read */
#ifdef GLX_SGI_swap_control
  GLXEW_SGI_swap_control = _glewSearchExtension("GLX_SGI_swap_control", extStart, extEnd);
  if (glewExperimental || GLXEW_SGI_swap_control) GLXEW_SGI_swap_control = !_glewInit_GLX_SGI_swap_control(GLEW_CONTEXT_ARG_VAR_INIT);
#endif /* GLX_SGI_swap_control */
#ifdef GLX_SGI_video_sync
  GLXEW_SGI_video_sync = _glewSearchExtension("GLX_SGI_video_sync", extStart, extEnd);
  if (glewExperimental || GLXEW_SGI_video_sync) GLXEW_SGI_video_sync = !_glewInit_GLX_SGI_video_sync(GLEW_CONTEXT_ARG_VAR_INIT);
#endif /* GLX_SGI_video_sync */
#ifdef GLX_SUN_get_transparent_index
  GLXEW_SUN_get_transparent_index = _glewSearchExtension("GLX_SUN_get_transparent_index", extStart, extEnd);
  if (glewExperimental || GLXEW_SUN_get_transparent_index) GLXEW_SUN_get_transparent_index = !_glewInit_GLX_SUN_get_transparent_index(GLEW_CONTEXT_ARG_VAR_INIT);
#endif /* GLX_SUN_get_transparent_index */
#ifdef GLX_SUN_video_resize
  GLXEW_SUN_video_resize = _glewSearchExtension("GLX_SUN_video_resize", extStart, extEnd);
  if (glewExperimental || GLXEW_SUN_video_resize) GLXEW_SUN_video_resize = !_glewInit_GLX_SUN_video_resize(GLEW_CONTEXT_ARG_VAR_INIT);
#endif /* GLX_SUN_video_resize */

  return GLEW_OK;
}